

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::set_outflow_bcs
          (MacProj *this,int level,MultiFab *mac_phi,MultiFab *param_4,MultiFab *param_5,
          MultiFab *param_6)

{
  undefined8 uVar1;
  bool bVar2;
  Side SVar3;
  int iVar4;
  FabArrayBase *pFVar5;
  AmrLevel **ppAVar6;
  Geometry *this_00;
  IntVect *pIVar7;
  Long LVar8;
  BaseFab<double> *this_01;
  BoxArray *in_RDI;
  IntVect IVar9;
  Box ovlp;
  MFIter mfi;
  int iface_1;
  BoxArray phiBoxArray;
  BoxArray uncovered_outflow_ba;
  Box *valid_ccBndBox;
  Box phiBox;
  Box ccBndBox;
  int outDir;
  int iface;
  int nOutFlowTouched;
  BoxList phiBoxList;
  BoxList ccBoxList;
  Box *domain;
  Geometry *geom;
  BoxArray *grids;
  int numOutFlowFaces;
  Orientation outFaces [6];
  bool hasOutFlow;
  IndexType typ;
  int bg;
  uint bitval;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int sm;
  IntVect hi_1;
  IntVect low_1;
  IndexType typ_2;
  int bg_1;
  uint bitval_1;
  int sm_1;
  int dir;
  IntVect hi_2;
  IntVect low_2;
  MFIter *in_stack_fffffffffffffa38;
  undefined6 in_stack_fffffffffffffa40;
  byte in_stack_fffffffffffffa46;
  undefined1 in_stack_fffffffffffffa47;
  int *in_stack_fffffffffffffa48;
  BoxArray *in_stack_fffffffffffffa50;
  BoxArray *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  uchar in_stack_fffffffffffffa67;
  FabArrayBase *local_580;
  Orientation *in_stack_fffffffffffffa98;
  Box *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  Box *in_stack_fffffffffffffab0;
  BoxArray *in_stack_fffffffffffffab8;
  MFIter local_538;
  int local_4d4;
  byte local_461;
  int local_38c [7];
  int *local_370;
  int local_364;
  undefined1 local_360 [56];
  undefined1 local_328 [24];
  IndexType local_310;
  undefined1 local_30c [24];
  IndexType local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  Box *local_298;
  Geometry *local_290;
  BoxArray *local_288;
  int local_27c;
  undefined1 local_278 [84];
  uint local_224;
  uint local_220;
  int local_21c;
  int local_218 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  int local_200;
  uint local_1fc;
  IntVect local_1f8;
  IntVect local_1e8;
  uint local_1d8;
  int local_1d4;
  Box *local_1d0;
  uint local_1c4;
  uint local_1c0;
  int local_1bc;
  IntVect local_1b8;
  IntVect local_1ac;
  int local_1a0;
  int local_19c;
  Box *local_198;
  uint local_18c;
  uint local_188;
  int local_184;
  int local_180 [3];
  undefined8 local_16c;
  int local_164;
  uint local_160;
  int local_15c;
  uint local_158;
  IntVect local_154;
  IntVect local_148;
  int local_13c;
  Box *local_138;
  Orientation local_12c;
  char *local_128;
  uint local_11c;
  IntVect *local_118;
  uint local_10c;
  IntVect *local_108;
  uint local_fc;
  undefined8 *local_f8;
  int local_ec;
  IntVect *local_e8;
  int local_dc;
  IntVect *local_d8;
  int local_cc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_c8;
  int local_c0;
  uint local_bc;
  IntVect *local_b8;
  int local_b0;
  uint local_ac;
  IntVect *local_a8;
  int local_a0;
  uint local_9c;
  IntVect *local_98;
  int local_90;
  uint local_8c;
  IntVect *local_88;
  int local_80;
  int local_7c;
  IntVect *local_78;
  int local_70;
  int local_6c;
  IntVect *local_68;
  int local_60;
  int local_5c;
  IntVect *local_58;
  int local_50;
  int local_4c;
  IntVect *local_48;
  uint local_3c;
  uint *local_38;
  int local_2c;
  uint *local_28;
  int local_1c;
  uint *local_18;
  int local_c;
  int local_8;
  uint local_4;
  
  pFVar5 = (FabArrayBase *)local_278;
  do {
    local_580 = pFVar5;
    amrex::Orientation::Orientation((Orientation *)local_580);
    pFVar5 = (FabArrayBase *)
             ((long)&(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                      &local_580->_vptr_FabArrayBase)->
                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + 4);
  } while (pFVar5 != (FabArrayBase *)(local_278 + 0x18));
  OutFlowBC::GetOutFlowFaces
            ((bool *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
             (Orientation *)in_stack_fffffffffffffa58,(BCRec *)in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa48);
  ppAVar6 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       CONCAT17(in_stack_fffffffffffffa47,
                                CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                       (size_type)in_stack_fffffffffffffa38);
  local_288 = amrex::AmrLevel::boxArray(*ppAVar6);
  local_290 = amrex::AmrMesh::Geom
                        ((AmrMesh *)
                         CONCAT17(in_stack_fffffffffffffa47,
                                  CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                         (int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
  this_00 = amrex::AmrMesh::Geom
                      ((AmrMesh *)
                       CONCAT17(in_stack_fffffffffffffa47,
                                CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                       (int)((ulong)in_stack_fffffffffffffa38 >> 0x20));
  local_298 = amrex::Geometry::Domain(this_00);
  amrex::BoxList::BoxList((BoxList *)in_stack_fffffffffffffa38);
  amrex::BoxList::BoxList((BoxList *)in_stack_fffffffffffffa38);
  local_2e8 = 0;
  for (local_2ec = 0; local_2ec < local_27c; local_2ec = local_2ec + 1) {
    in_stack_fffffffffffffa58 = local_288;
    amrex::Geometry::Domain(local_290);
    in_stack_fffffffffffffa67 =
         grids_on_side_of_domain
                   ((BoxArray *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                    in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    if ((bool)in_stack_fffffffffffffa67) {
      local_2e8 = local_2e8 + 1;
      local_2f0 = amrex::Orientation::coordDir((Orientation *)(local_278 + (long)local_2ec * 4));
      amrex::Box::Box((Box *)CONCAT17(in_stack_fffffffffffffa47,
                                      CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40))
                     );
      SVar3 = amrex::Orientation::faceDir((Orientation *)(local_278 + (long)local_2ec * 4));
      if (SVar3 == high) {
        local_1d0 = local_298;
        local_1d4 = local_2f0;
        local_1d8 = 2;
        pIVar7 = amrex::Box::smallEnd(local_298);
        local_1e8.vect[2] = pIVar7->vect[2];
        local_1e8.vect._0_8_ = *(undefined8 *)pIVar7->vect;
        pIVar7 = amrex::Box::bigEnd(local_1d0);
        local_1f8.vect[2] = pIVar7->vect[2];
        local_1f8.vect._0_8_ = *(undefined8 *)pIVar7->vect;
        local_218 = (int  [3])amrex::Box::type((Box *)in_stack_fffffffffffffa58);
        local_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._0_8_;
        local_200 = local_218[2];
        local_cc = local_1d4;
        local_1fc = *(uint *)((long)&local_208._M_pi + (long)local_1d4 * 4);
        local_dc = local_1d4;
        local_21c = (local_1f8.vect[local_1d4] + 1) - (local_1fc & 1);
        local_4c = local_1d4;
        local_1e8.vect[local_1d4] = local_21c;
        iVar4 = local_21c + local_1d8 + -1;
        local_5c = local_1d4;
        local_1f8.vect[local_1d4] = iVar4;
        local_d8 = &local_1f8;
        local_c8 = &local_208;
        local_60 = iVar4;
        local_58 = &local_1f8;
        local_50 = local_21c;
        local_48 = &local_1e8;
        local_224 = (uint)amrex::Box::ixType(local_1d0);
        local_18 = &local_220;
        local_1c = local_1d4;
        local_c = local_1d4;
        local_224 = (1 << ((byte)local_1d4 & 0x1f) ^ 0xffffffffU) & local_224;
        local_220 = local_224;
        amrex::Box::Box((Box *)local_328,&local_1e8,&local_1f8,(IndexType)local_224);
        local_30c._0_8_ = local_328._0_8_;
        local_30c._8_8_ = local_328._8_8_;
        local_30c._16_8_ = local_328._16_8_;
        local_2f4.itype = local_310.itype;
        amrex::Box::shift((Box *)local_30c,local_2f0,-2);
      }
      else {
        local_198 = local_298;
        local_19c = local_2f0;
        local_1a0 = 2;
        pIVar7 = amrex::Box::smallEnd(local_298);
        local_1ac.vect._0_8_ = *(undefined8 *)pIVar7->vect;
        local_1ac.vect[2] = pIVar7->vect[2];
        pIVar7 = amrex::Box::bigEnd(local_198);
        uVar1 = *(undefined8 *)pIVar7->vect;
        iVar4 = pIVar7->vect[2];
        local_ec = local_19c;
        local_1bc = local_1ac.vect[local_19c];
        local_6c = local_19c;
        local_1ac.vect[local_19c] = local_1bc - local_1a0;
        local_7c = local_19c;
        local_1b8.vect[local_19c] = local_1bc + -1;
        local_1b8.vect._0_8_ = uVar1;
        local_1b8.vect[2] = iVar4;
        local_e8 = &local_1ac;
        local_80 = local_1bc + -1;
        local_78 = &local_1b8;
        local_70 = local_1bc - local_1a0;
        local_68 = &local_1ac;
        local_1c4 = (uint)amrex::Box::ixType(local_198);
        local_28 = &local_1c0;
        local_2c = local_19c;
        local_8 = local_19c;
        local_1c4 = (1 << ((byte)local_19c & 0x1f) ^ 0xffffffffU) & local_1c4;
        local_1c0 = local_1c4;
        amrex::Box::Box((Box *)(local_360 + 0x1c),&local_1ac,&local_1b8,(IndexType)local_1c4);
        local_30c._0_8_ = local_360._28_8_;
        local_30c._8_8_ = local_360._36_8_;
        local_30c._16_8_ = local_360._44_8_;
        local_2f4.itype = local_360._52_4_;
        amrex::Box::shift((Box *)local_30c,local_2f0,2);
      }
      amrex::BoxList::push_back
                ((BoxList *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                 (Box *)in_stack_fffffffffffffa38);
      local_364 = *(int *)(local_278 + (long)local_2ec * 4);
      local_138 = local_298;
      local_13c = 1;
      local_12c.val = local_364;
      pIVar7 = amrex::Box::smallEnd(local_298);
      local_148.vect._0_8_ = *(undefined8 *)pIVar7->vect;
      local_148.vect[2] = pIVar7->vect[2];
      pIVar7 = amrex::Box::bigEnd(local_138);
      local_154.vect._0_8_ = *(undefined8 *)pIVar7->vect;
      local_154.vect[2] = pIVar7->vect[2];
      local_158 = amrex::Orientation::coordDir(&local_12c);
      bVar2 = amrex::Orientation::isLow(&local_12c);
      if (bVar2) {
        local_11c = local_158;
        local_15c = local_148.vect[(int)local_158];
        local_ac = local_158;
        local_148.vect[(int)local_158] = local_15c - local_13c;
        local_bc = local_158;
        local_154.vect[(int)local_158] = local_15c + -1;
        local_118 = &local_148;
        local_c0 = local_15c + -1;
        local_b8 = &local_154;
        local_b0 = local_15c - local_13c;
        local_a8 = &local_148;
      }
      else {
        IVar9 = amrex::Box::type((Box *)in_stack_fffffffffffffa58);
        local_180._0_8_ = IVar9.vect._0_8_;
        local_16c._0_4_ = local_180[0];
        local_16c._4_4_ = local_180[1];
        local_180[2] = IVar9.vect[2];
        local_164 = local_180[2];
        local_fc = local_158;
        local_160 = *(uint *)((long)&local_16c + (long)(int)local_158 * 4);
        local_10c = local_158;
        local_184 = (local_154.vect[(int)local_158] + 1) - (local_160 & 1);
        local_8c = local_158;
        local_148.vect[(int)local_158] = local_184;
        iVar4 = local_184 + local_13c + -1;
        local_9c = local_158;
        local_154.vect[(int)local_158] = iVar4;
        local_180 = IVar9.vect;
        local_108 = &local_154;
        local_f8 = &local_16c;
        local_a0 = iVar4;
        local_98 = &local_154;
        local_90 = local_184;
        local_88 = &local_148;
      }
      local_18c = (uint)amrex::Box::ixType(local_138);
      local_38 = &local_188;
      local_3c = local_158;
      local_4 = local_158;
      local_18c = local_18c & ~(1 << (local_158 & 0x1f));
      in_stack_fffffffffffffa50 = (BoxArray *)local_360;
      local_188 = local_18c;
      amrex::Box::Box((Box *)in_stack_fffffffffffffa50,&local_148,&local_154,(IndexType)local_18c);
      amrex::BoxList::push_back
                ((BoxList *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                 (Box *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa48 = local_38c;
      amrex::Box::operator&
                ((Box *)CONCAT17(in_stack_fffffffffffffa47,
                                 CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                 (Box *)in_stack_fffffffffffffa38);
      local_370 = in_stack_fffffffffffffa48;
      amrex::complementIn((Box *)local_580,
                          (BoxArray *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60))
      ;
      LVar8 = amrex::BoxArray::size((BoxArray *)0x84755f);
      local_461 = 0;
      in_stack_fffffffffffffa46 = false;
      if (LVar8 != 0) {
        amrex::intersect(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                         in_stack_fffffffffffffaac);
        local_461 = 1;
        LVar8 = amrex::BoxArray::size((BoxArray *)0x8475ac);
        in_stack_fffffffffffffa46 = LVar8 != 0;
      }
      in_stack_fffffffffffffa47 = in_stack_fffffffffffffa46;
      if ((local_461 & 1) != 0) {
        amrex::BoxArray::~BoxArray
                  ((BoxArray *)
                   CONCAT17(in_stack_fffffffffffffa46,
                            CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
      }
      if ((in_stack_fffffffffffffa46 & 1) != 0) {
        local_128 = "MacProj: Cannot yet handle partially refined outflow";
        amrex::Error_host((char *)in_stack_fffffffffffffa50);
      }
      amrex::BoxArray::~BoxArray
                ((BoxArray *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
    }
  }
  bVar2 = amrex::BoxList::isEmpty((BoxList *)0x84765c);
  if (!bVar2) {
    amrex::BoxArray::BoxArray(in_RDI,(BoxList *)local_580);
    amrex::BoxList::clear((BoxList *)0x847688);
    for (local_4d4 = 0; local_4d4 < local_2e8; local_4d4 = local_4d4 + 1) {
      amrex::MFIter::MFIter((MFIter *)in_RDI,local_580,in_stack_fffffffffffffa67);
      while (bVar2 = amrex::MFIter::isValid(&local_538), bVar2) {
        this_01 = &amrex::FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)
                              CONCAT17(in_stack_fffffffffffffa47,
                                       CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)
                                      ),in_stack_fffffffffffffa38)->super_BaseFab<double>;
        in_stack_fffffffffffffa38 = (MFIter *)amrex::BaseFab<double>::box(this_01);
        amrex::BoxArray::operator[]
                  (in_stack_fffffffffffffa50,(int)((ulong)in_stack_fffffffffffffa48 >> 0x20));
        amrex::Box::operator&
                  ((Box *)CONCAT17(in_stack_fffffffffffffa47,
                                   CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                   (Box *)in_stack_fffffffffffffa38);
        bVar2 = amrex::Box::ok((Box *)&stack0xfffffffffffffaac);
        if (bVar2) {
          amrex::FabArray<amrex::FArrayBox>::operator[]
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT17(in_stack_fffffffffffffa47,
                              CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)),
                     in_stack_fffffffffffffa38);
          amrex::BaseFab<double>::setVal<(amrex::RunOn)0>
                    ((BaseFab<double> *)in_RDI,(double *)local_580,
                     (Box *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                     (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),(int)in_stack_fffffffffffffa58)
          ;
        }
        amrex::MFIter::operator++(&local_538);
      }
      amrex::MFIter::~MFIter
                ((MFIter *)
                 CONCAT17(in_stack_fffffffffffffa47,
                          CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
    }
    amrex::BoxArray::~BoxArray
              ((BoxArray *)
               CONCAT17(in_stack_fffffffffffffa47,
                        CONCAT16(in_stack_fffffffffffffa46,in_stack_fffffffffffffa40)));
  }
  amrex::BoxList::~BoxList((BoxList *)0x8477e8);
  amrex::BoxList::~BoxList((BoxList *)0x8477f5);
  return;
}

Assistant:

void
MacProj::set_outflow_bcs (int             level,
                          MultiFab*       mac_phi,
                          const MultiFab* /*u_mac*/,
                          const MultiFab& /*S*/,
                          const MultiFab& /*divu*/)
{
    //
    // This code is very similar to the outflow BC stuff in the Projection
    // class except that here the the phi to be solved for lives on the
    // out-directed faces.  The projection equation to satisfy is
    //
    //   (1/r)(d/dr)[r/rho dphi/dr] = dv/dr - S
    //
    bool hasOutFlow;
    Orientation outFaces[2*BL_SPACEDIM];
    int numOutFlowFaces;

    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFaces);

    const BoxArray&   grids  = LevelData[level]->boxArray();
    const Geometry&   geom   = parent->Geom(level);
    const Box&        domain = parent->Geom(level).Domain();
    //
    // Create 1-wide cc box just outside boundary to hold phi.
    //
    BoxList ccBoxList, phiBoxList;
    // numOutFlowFaces gives the number of outflow faces on the entire
    //   problem domain
    // nOutFlowTouched gives the number of outflow faces a level touches, so
    //   nOutFlowTouched = numOutFlowFaces for level 0, but
    //   nOutFlowTouched <= numOutFlowFaces for levels > 0, since
    //   finer levels may not span the entire problem domain
    int nOutFlowTouched = 0;
    for (int iface = 0; iface < numOutFlowFaces; iface++)
    {
        if (grids_on_side_of_domain(grids,geom.Domain(),outFaces[iface]))
        {
            nOutFlowTouched++;
            const int outDir    = outFaces[iface].coordDir();

            Box ccBndBox;
            if (outFaces[iface].faceDir() == Orientation::high)
            {
                ccBndBox = amrex::adjCellHi(domain,outDir,2);
                ccBndBox.shift(outDir,-2);
            }
            else
            {
                ccBndBox = amrex::adjCellLo(domain,outDir,2);
                ccBndBox.shift(outDir,2);
            }
            ccBoxList.push_back(ccBndBox);

            Box phiBox  = amrex::adjCell(domain,outFaces[iface],1);
            phiBoxList.push_back(phiBox);

            const Box&     valid_ccBndBox       = ccBndBox & domain;
            const BoxArray uncovered_outflow_ba = amrex::complementIn(valid_ccBndBox,grids);

            if (uncovered_outflow_ba.size() &&
                amrex::intersect(grids,valid_ccBndBox).size())
                amrex::Error("MacProj: Cannot yet handle partially refined outflow");
        }
    }

    if ( !ccBoxList.isEmpty() )
    {
        BoxArray phiBoxArray(phiBoxList);
        phiBoxList.clear();

        //
        // Must do this kind of copy instead of mac_phi->copy(phidat);
        // because we're copying onto the ghost cells of the FABs,
        // not the valid regions.
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for ( int iface = 0; iface < nOutFlowTouched; ++iface )
        {
            for (MFIter mfi(*mac_phi); mfi.isValid(); ++mfi)
            {
                Box ovlp = (*mac_phi)[mfi].box() & phiBoxArray[iface];
                if (ovlp.ok()) {
                      (*mac_phi)[mfi].setVal<RunOn::Gpu>(0,ovlp,0,1);
                }
            }
        }
    }
}